

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_push(DisasContext_conflict2 *s,TCGv_i32 val)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 *ppTVar1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar1 = s->writeback;
  }
  tcg_gen_subi_i32_m68k(tcg_ctx,ret,ppTVar1[7],4);
  gen_store(s,2,ret,val,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar1 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar1 = s->writeback;
  }
  tcg_gen_mov_i32(tcg_ctx,ppTVar1[7],ret);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_push(DisasContext *s, TCGv val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_subi_i32(tcg_ctx, tmp, QREG_SP, 4);
    gen_store(s, OS_LONG, tmp, val, IS_USER(s));
    tcg_gen_mov_i32(tcg_ctx, QREG_SP, tmp);
    tcg_temp_free(tcg_ctx, tmp);
}